

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O0

bool anon_unknown.dwarf_5efb0a::FindScriptPubKey
               (atomic<int> *scan_progress,atomic<bool> *should_abort,int64_t *count,
               CCoinsViewCursor *cursor,
               set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *needles,
               map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
               *out_results,function<void_()> *interruption_point)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  ulong uVar4;
  byte *pbVar5;
  long *in_RCX;
  long *in_RDX;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_COutPoint,_Coin>_>,_bool> pVar6;
  uint32_t high;
  Coin coin;
  COutPoint key;
  COutPoint *in_stack_fffffffffffffef8;
  undefined6 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff06;
  undefined1 in_stack_ffffffffffffff07;
  _Rb_tree_iterator<std::pair<const_COutPoint,_Coin>_> in_stack_ffffffffffffff08;
  COutPoint *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  byte local_71;
  undefined1 local_60 [52];
  undefined1 local_2c [36];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__atomic_base<int>::operator=
            ((__atomic_base<int> *)in_stack_ffffffffffffff10,
             (__int_type)((ulong)in_stack_ffffffffffffff08._M_node >> 0x20));
  *in_RDX = 0;
  do {
    uVar4 = (**(code **)(*in_RCX + 0x20))();
    if ((uVar4 & 1) == 0) {
      std::__atomic_base<int>::operator=
                ((__atomic_base<int> *)in_stack_ffffffffffffff10,
                 (__int_type)((ulong)in_stack_ffffffffffffff08._M_node >> 0x20));
      local_71 = 1;
      break;
    }
    COutPoint::COutPoint(in_stack_fffffffffffffef8);
    Coin::Coin((Coin *)in_stack_fffffffffffffef8);
    bVar2 = (**(code **)(*in_RCX + 0x10))(in_RCX,local_2c);
    if (((bVar2 & 1) == 0) ||
       (bVar2 = (**(code **)(*in_RCX + 0x18))(in_RCX,local_60), (bVar2 & 1) == 0)) {
      local_71 = 0;
      bVar3 = true;
    }
    else {
      lVar1 = *in_RDX;
      *in_RDX = lVar1 + 1;
      if ((lVar1 + 1) % 0x2000 == 0) {
        std::function<void_()>::operator()((function<void_()> *)in_stack_fffffffffffffef8);
        bVar3 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffff10);
        if (bVar3) {
          local_71 = 0;
          bVar3 = true;
          goto LAB_0058c686;
        }
      }
      if (*in_RDX % 0x100 == 0) {
        transaction_identifier<false>::begin(&in_stack_fffffffffffffef8->hash);
        pbVar5 = UCharCast((byte *)in_stack_fffffffffffffef8);
        in_stack_ffffffffffffff1c = (uint)*pbVar5 << 8;
        transaction_identifier<false>::begin(&in_stack_fffffffffffffef8->hash);
        UCharCast((byte *)in_stack_fffffffffffffef8);
        std::__atomic_base<int>::operator=
                  ((__atomic_base<int> *)in_stack_ffffffffffffff10,
                   (__int_type)((ulong)in_stack_ffffffffffffff08._M_node >> 0x20));
      }
      in_stack_ffffffffffffff10 =
           (COutPoint *)
           std::set<CScript,_std::less<CScript>,_std::allocator<CScript>_>::count
                     ((set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *)
                      in_stack_ffffffffffffff08._M_node,
                      (key_type *)
                      CONCAT17(in_stack_ffffffffffffff07,
                               CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)));
      if (in_stack_ffffffffffffff10 != (COutPoint *)0x0) {
        pVar6 = std::
                map<COutPoint,Coin,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,Coin>>>
                ::emplace<COutPoint&,Coin&>
                          ((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                            *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                           in_stack_ffffffffffffff10,(Coin *)in_stack_ffffffffffffff08._M_node);
        in_stack_ffffffffffffff08 = pVar6.first._M_node;
        in_stack_ffffffffffffff07 = pVar6.second;
      }
      (**(code **)(*in_RCX + 0x28))();
      bVar3 = false;
    }
LAB_0058c686:
    Coin::~Coin((Coin *)in_stack_fffffffffffffef8);
  } while (!bVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_71 & 1);
}

Assistant:

bool FindScriptPubKey(std::atomic<int>& scan_progress, const std::atomic<bool>& should_abort, int64_t& count, CCoinsViewCursor* cursor, const std::set<CScript>& needles, std::map<COutPoint, Coin>& out_results, std::function<void()>& interruption_point)
{
    scan_progress = 0;
    count = 0;
    while (cursor->Valid()) {
        COutPoint key;
        Coin coin;
        if (!cursor->GetKey(key) || !cursor->GetValue(coin)) return false;
        if (++count % 8192 == 0) {
            interruption_point();
            if (should_abort) {
                // allow to abort the scan via the abort reference
                return false;
            }
        }
        if (count % 256 == 0) {
            // update progress reference every 256 item
            uint32_t high = 0x100 * *UCharCast(key.hash.begin()) + *(UCharCast(key.hash.begin()) + 1);
            scan_progress = (int)(high * 100.0 / 65536.0 + 0.5);
        }
        if (needles.count(coin.out.scriptPubKey)) {
            out_results.emplace(key, coin);
        }
        cursor->Next();
    }
    scan_progress = 100;
    return true;
}